

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

Matrix * __thiscall
QPDFPageObjectHelper::getMatrixForTransformations
          (Matrix *__return_storage_ptr__,QPDFPageObjectHelper *this,bool invert)

{
  bool bVar1;
  int local_204;
  double local_1f8;
  Matrix local_1a8;
  Matrix local_178;
  Matrix local_148;
  Matrix local_118;
  int local_e4;
  double dStack_e0;
  int rotate;
  double scale;
  double height;
  double width;
  Rectangle rect;
  string local_a0 [32];
  undefined1 local_80 [8];
  QPDFObjectHandle scale_obj;
  string local_68 [32];
  undefined1 local_48 [8];
  QPDFObjectHandle rotate_obj;
  QPDFObjectHandle bbox;
  bool invert_local;
  QPDFPageObjectHelper *this_local;
  
  bbox.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = invert;
  QPDFObjectHandle::Matrix::Matrix(__return_storage_ptr__,1.0,0.0,0.0,1.0,0.0,0.0);
  getTrimBox((QPDFPageObjectHelper *)&stack0xffffffffffffffd8,SUB81(this,0),false);
  bVar1 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  if (!bVar1) {
    rotate_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = 1;
    goto LAB_002f3e2d;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,"/Rotate",
             (allocator<char> *)
             ((long)&scale_obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  getAttribute((QPDFPageObjectHelper *)local_48,(string *)this,SUB81(local_68,0));
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&scale_obj.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"/UserUnit",(allocator<char> *)((long)&rect.ury + 7));
  getAttribute((QPDFPageObjectHelper *)local_80,(string *)this,SUB81(local_a0,0));
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rect.ury + 7));
  bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_48);
  if ((!bVar1) || (bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_80), !bVar1)) {
    QPDFObjectHandle::getArrayAsRectangle
              ((Rectangle *)&width,(QPDFObjectHandle *)&stack0xffffffffffffffd8);
    height = rect.lly - width;
    scale = rect.urx - rect.llx;
    bVar1 = QPDFObjectHandle::isNumber((QPDFObjectHandle *)local_80);
    if (bVar1) {
      local_1f8 = QPDFObjectHandle::getNumericValue((QPDFObjectHandle *)local_80);
    }
    else {
      local_1f8 = 1.0;
    }
    dStack_e0 = local_1f8;
    bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_48);
    if (bVar1) {
      local_204 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_48);
    }
    else {
      local_204 = 0;
    }
    local_e4 = local_204;
    if ((bbox.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._7_1_ & 1) != 0) {
      if ((dStack_e0 == 0.0) && (!NAN(dStack_e0))) goto LAB_002f3e0e;
      dStack_e0 = 1.0 / dStack_e0;
      local_e4 = 0x168 - local_204;
    }
    if (local_e4 == 0x5a) {
      QPDFObjectHandle::Matrix::Matrix
                (&local_118,0.0,-dStack_e0,dStack_e0,0.0,0.0,height * dStack_e0);
      memcpy(__return_storage_ptr__,&local_118,0x30);
    }
    else if (local_e4 == 0xb4) {
      QPDFObjectHandle::Matrix::Matrix
                (&local_148,-dStack_e0,0.0,0.0,-dStack_e0,height * dStack_e0,scale * dStack_e0);
      memcpy(__return_storage_ptr__,&local_148,0x30);
    }
    else if (local_e4 == 0x10e) {
      QPDFObjectHandle::Matrix::Matrix
                (&local_178,0.0,dStack_e0,-dStack_e0,0.0,scale * dStack_e0,0.0);
      memcpy(__return_storage_ptr__,&local_178,0x30);
    }
    else {
      QPDFObjectHandle::Matrix::Matrix(&local_1a8,dStack_e0,0.0,0.0,dStack_e0,0.0,0.0);
      memcpy(__return_storage_ptr__,&local_1a8,0x30);
    }
  }
LAB_002f3e0e:
  rotate_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 1;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_80);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
LAB_002f3e2d:
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Matrix
QPDFPageObjectHelper::getMatrixForTransformations(bool invert)
{
    QPDFObjectHandle::Matrix matrix(1, 0, 0, 1, 0, 0);
    QPDFObjectHandle bbox = getTrimBox(false);
    if (!bbox.isRectangle()) {
        return matrix;
    }
    QPDFObjectHandle rotate_obj = getAttribute("/Rotate", false);
    QPDFObjectHandle scale_obj = getAttribute("/UserUnit", false);
    if (!(rotate_obj.isNull() && scale_obj.isNull())) {
        QPDFObjectHandle::Rectangle rect = bbox.getArrayAsRectangle();
        double width = rect.urx - rect.llx;
        double height = rect.ury - rect.lly;
        double scale = (scale_obj.isNumber() ? scale_obj.getNumericValue() : 1.0);
        int rotate = (rotate_obj.isInteger() ? rotate_obj.getIntValueAsInt() : 0);
        if (invert) {
            if (scale == 0.0) {
                return matrix;
            }
            scale = 1.0 / scale;
            rotate = 360 - rotate;
        }

        // Ignore invalid rotation angle
        switch (rotate) {
        case 90:
            matrix = QPDFObjectHandle::Matrix(0, -scale, scale, 0, 0, width * scale);
            break;
        case 180:
            matrix = QPDFObjectHandle::Matrix(-scale, 0, 0, -scale, width * scale, height * scale);
            break;
        case 270:
            matrix = QPDFObjectHandle::Matrix(0, scale, -scale, 0, height * scale, 0);
            break;
        default:
            matrix = QPDFObjectHandle::Matrix(scale, 0, 0, scale, 0, 0);
            break;
        }
    }
    return matrix;
}